

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_ambush(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  CClass *this;
  char *pcVar4;
  CHAR_DATA *in_RDI;
  float fVar5;
  float chance;
  char buf [4608];
  CHAR_DATA *victim;
  char arg [4608];
  undefined4 in_stack_ffffffffffffdbb8;
  undefined4 in_stack_ffffffffffffdbbc;
  CHAR_DATA *in_stack_ffffffffffffdbc0;
  CHAR_DATA *looker;
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  int in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd4;
  undefined4 in_stack_ffffffffffffdbd8;
  undefined1 show;
  int in_stack_ffffffffffffdbdc;
  int in_stack_ffffffffffffdbe0;
  int in_stack_ffffffffffffdbe4;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  CHAR_DATA *in_stack_ffffffffffffdc20;
  CHAR_DATA *in_stack_ffffffffffffdc28;
  int in_stack_ffffffffffffdc94;
  undefined1 in_stack_ffffffffffffdc9b;
  int in_stack_ffffffffffffdc9c;
  GEN_DATA *in_stack_ffffffffffffdca0;
  int in_stack_ffffffffffffdcbc;
  CHAR_DATA *in_stack_ffffffffffffdcc0;
  int in_stack_ffffffffffffdde4;
  CHAR_DATA *in_stack_ffffffffffffdde8;
  CHAR_DATA *in_stack_ffffffffffffddf0;
  int in_stack_ffffffffffffedb8;
  int in_stack_ffffffffffffedbc;
  CHAR_DATA *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char local_1218;
  
  one_argument((char *)in_stack_ffffffffffffdbc0,
               (char *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
  if (local_1218 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                 in_stack_ffffffffffffdbc8);
    return;
  }
  if (in_RDI->fighting != (CHAR_DATA *)0x0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                 in_stack_ffffffffffffdbc8);
    return;
  }
  ch_00 = get_char_room(in_stack_ffffffffffffedc8,(char *)in_stack_ffffffffffffedc0);
  if (ch_00 == (CHAR_DATA *)0x0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                 in_stack_ffffffffffffdbc8);
    return;
  }
  bVar1 = is_affected_by(in_stack_ffffffffffffdbc8,(int)((ulong)in_stack_ffffffffffffdbc0 >> 0x20));
  if (bVar1) {
    bVar1 = can_see((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                    (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0));
    show = (undefined1)((uint)in_stack_ffffffffffffdbd8 >> 0x18);
    if (!bVar1) {
      if (ch_00 == in_RDI) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                     in_stack_ffffffffffffdbc8);
        return;
      }
      bVar1 = is_safe(in_stack_ffffffffffffdbc0,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
      if (bVar1) {
        return;
      }
      bVar1 = check_shroud_of_light(in_stack_ffffffffffffdc28,in_stack_ffffffffffffdc20);
      if (bVar1) {
        return;
      }
      bVar1 = check_sidestep(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
                             in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8);
      if (bVar1) {
        return;
      }
      iVar2 = get_skill(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcbc);
      fVar5 = (float)iVar2;
      if (ch_00->fighting == (CHAR_DATA *)0x0) {
LAB_005e8af9:
        if ((ch_00->fighting != (CHAR_DATA *)0x0) &&
           (iVar2 = number_percent(), fVar5 <= (float)iVar2)) {
          send_to_char((char *)CONCAT44(fVar5,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8);
          return;
        }
        bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
        if ((!bVar1) &&
           ((bVar1 = is_npc((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8)), !bVar1
            && (ch_00->fighting == (CHAR_DATA *)0x0)))) {
          looker = (CHAR_DATA *)&stack0xffffffffffffdbd8;
          pcVar4 = pers(in_stack_ffffffffffffdbc8,looker);
          sprintf((char *)looker,"Help! I\'ve been ambushed by %s!",pcVar4);
          do_myell((CHAR_DATA *)CONCAT44(fVar5,in_stack_ffffffffffffdbd0),
                   (char *)in_stack_ffffffffffffdbc8,looker);
        }
        WAIT_STATE((CHAR_DATA *)CONCAT44(fVar5,in_stack_ffffffffffffdbd0),
                   (int)((ulong)in_stack_ffffffffffffdbc8 >> 0x20));
        iVar2 = number_percent();
        iVar3 = get_skill(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcbc);
        if ((iVar3 <= iVar2) &&
           ((iVar2 = get_skill(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcbc), iVar2 < 2 ||
            (bVar1 = is_awake(ch_00), bVar1)))) {
          check_improve((CHAR_DATA *)in_stack_ffffffffffffdca0,in_stack_ffffffffffffdc9c,
                        (bool)in_stack_ffffffffffffdc9b,in_stack_ffffffffffffdc94);
          damage(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbe4,
                 in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc,(bool)show);
          return;
        }
        check_improve((CHAR_DATA *)in_stack_ffffffffffffdca0,in_stack_ffffffffffffdc9c,
                      (bool)in_stack_ffffffffffffdc9b,in_stack_ffffffffffffdc94);
        multi_hit(in_stack_ffffffffffffddf0,in_stack_ffffffffffffdde8,in_stack_ffffffffffffdde4);
        return;
      }
      if (3.0 <= fVar5) {
        in_stack_ffffffffffffdbd0 = (int)in_RDI->level;
        in_stack_ffffffffffffdbc8 = (CHAR_DATA *)(skill_table + gsn_moving_ambush);
        this = char_data::Class((char_data *)CONCAT44(fVar5,in_stack_ffffffffffffdbd0));
        iVar2 = CClass::GetIndex(this);
        if (*(short *)((long)&in_stack_ffffffffffffdbc8->next_in_room + (long)iVar2 * 2) <=
            in_stack_ffffffffffffdbd0) goto LAB_005e8af9;
      }
      send_to_char((char *)CONCAT44(fVar5,in_stack_ffffffffffffdbd0),in_stack_ffffffffffffdbc8);
      return;
    }
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
               in_stack_ffffffffffffdbc8);
  return;
}

Assistant:

void do_ambush(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];
	float chance;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Ambush whom?\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("But you're still fighting!\n\r", ch);
		return;
	}
	else if ((victim = get_char_room(ch, arg)) == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}
	else if (!is_affected_by(ch, AFF_CAMOUFLAGE) || can_see(victim, ch))
	{
		send_to_char("But they can still see you.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That's just not possible.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_shroud_of_light(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_ambush, 95))
		return;

	chance = get_skill(ch, gsn_moving_ambush);

	if (victim->fighting != nullptr &&
		(chance < 3 || ch->level < skill_table[gsn_moving_ambush].skill_level[ch->Class()->GetIndex()]))
	{
		send_to_char("They are moving around too much to ambush.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr && number_percent() >= chance)
	{
		send_to_char("You can't quite pin them down for your ambush.\n\r", ch);
		return;
	}

	if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
	{
		sprintf(buf, "Help! I've been ambushed by %s!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	WAIT_STATE(ch, skill_table[gsn_ambush].beats);

	if ((number_percent() < get_skill(ch, gsn_ambush)) || (get_skill(ch, gsn_ambush) >= 2 && !is_awake(victim)))
	{
		check_improve(ch, gsn_ambush, true, 1);
		multi_hit(ch, victim, gsn_ambush);
	}
	else
	{
		check_improve(ch, gsn_ambush, false, 1);
		damage(ch, victim, 0, gsn_ambush, DAM_NONE, true);
	}
}